

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::filterPoints(Earcut<unsigned_int> *this,Node *start,Node *end)

{
  double dVar1;
  Node *pNVar2;
  Node *pNVar3;
  bool bVar4;
  double dVar5;
  
  if (end == (Node *)0x0) {
    end = start;
  }
  do {
    if (start->steiner == false) {
      pNVar2 = start->next;
      dVar5 = start->x;
      dVar1 = pNVar2->x;
      if ((dVar5 != dVar1) || (NAN(dVar5) || NAN(dVar1))) {
LAB_00149dcf:
        dVar5 = (dVar1 - dVar5) * (start->y - start->prev->y) -
                (pNVar2->y - start->y) * (dVar5 - start->prev->x);
        if ((dVar5 != 0.0) || (NAN(dVar5))) goto LAB_00149da0;
      }
      else if ((start->y != pNVar2->y) || (NAN(start->y) || NAN(pNVar2->y))) goto LAB_00149dcf;
      pNVar2->prev = start->prev;
      end = start->prev;
      end->next = pNVar2;
      pNVar3 = start->prevZ;
      if (pNVar3 != (Node *)0x0) {
        pNVar3->nextZ = start->nextZ;
      }
      if (start->nextZ != (Node *)0x0) {
        start->nextZ->prevZ = pNVar3;
      }
      bVar4 = true;
      start = end;
      if (end == pNVar2) {
        return end;
      }
    }
    else {
LAB_00149da0:
      bVar4 = false;
      start = start->next;
    }
    if ((!bVar4) && (start == end)) {
      return end;
    }
  } while( true );
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::filterPoints(Node* start, Node* end) {
    if (!end) end = start;

    Node* p = start;
    bool again;
    do {
        again = false;

        if (!p->steiner && (equals(p, p->next) || area(p->prev, p, p->next) == 0)) {
            removeNode(p);
            p = end = p->prev;

            if (p == p->next) break;
            again = true;

        } else {
            p = p->next;
        }
    } while (again || p != end);

    return end;
}